

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_client.cpp
# Opt level: O2

bool tcp_connect(void)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  tcp_socket = socket(2,1,0);
  if (tcp_socket != -1) {
    server_address.sin_family = 2;
    server_address.sin_port = 0xd512;
    inet_pton(2,"192.168.4.1",&server_address.sin_addr);
    iVar1 = connect(tcp_socket,(sockaddr *)&server_address,0x10);
    bVar2 = -1 < iVar1;
  }
  return bVar2;
}

Assistant:

bool tcp_connect()
{
    using namespace std;

    tcp_socket = socket(AF_INET, SOCK_STREAM, 0);

    if (tcp_socket == -1)
    {
        return false;
    }

    server_address.sin_family = AF_INET;
    server_address.sin_port = htons(4821);
    inet_pton(AF_INET, "192.168.4.1", &server_address.sin_addr);

    if (connect(tcp_socket, (sockaddr *) &server_address, sizeof(server_address)) < 0)
    {
        return false;
    }

    return true;
}